

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderOperatorTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Performance::anon_unknown_1::OperatorPerformanceCase::render
          (OperatorPerformanceCase *this,int numDrawCalls)

{
  int iVar1;
  int iVar2;
  RenderContext *context;
  int iVar3;
  undefined4 extraout_var;
  bool bVar4;
  Surface SStack_68;
  PixelBufferAccess local_50;
  
  iVar3 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  iVar1 = this->m_gridSizeX;
  iVar2 = this->m_gridSizeY;
  if (numDrawCalls < 1) {
    numDrawCalls = 0;
  }
  while (bVar4 = numDrawCalls != 0, numDrawCalls = numDrawCalls + -1, bVar4) {
    (**(code **)(CONCAT44(extraout_var,iVar3) + 0x538))(4,0,iVar1 * iVar2 * 6);
  }
  context = this->m_renderCtx;
  tcu::Surface::Surface(&SStack_68,1,1);
  tcu::Surface::getAccess(&local_50,&SStack_68);
  glu::readPixels(context,0,0,&local_50);
  tcu::Surface::~Surface(&SStack_68);
  return;
}

Assistant:

void OperatorPerformanceCase::render (int numDrawCalls)
{
	const glw::Functions&	gl				= m_renderCtx.getFunctions();
	const int				numVertices		= getNumVertices(m_gridSizeX, m_gridSizeY);

	for (int callNdx = 0; callNdx < numDrawCalls; callNdx++)
		gl.drawArrays(GL_TRIANGLES, 0, numVertices);

	glu::readPixels(m_renderCtx, 0, 0, tcu::Surface(1, 1).getAccess()); // \note Serves as a more reliable replacement for glFinish().
}